

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O3

int do_flush(gzFile file,int flush)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  gz_stream *s;
  int iVar5;
  ulong uVar6;
  
  uVar3 = 0xfffffffe;
  if ((file != (gzFile)0x0) && (uVar3 = 0xfffffffe, *(char *)((long)file + 0xac) == 'w')) {
    *(undefined4 *)((long)file + 8) = 0;
    uVar6 = (ulong)*(uint *)((long)file + 0x20);
    bVar4 = false;
    do {
      iVar5 = (int)uVar6;
      if (iVar5 != 0x4000) {
        sVar2 = fwrite(*(void **)((long)file + 0x88),1,(ulong)(0x4000U - iVar5),
                       *(FILE **)((long)file + 0x78));
        if (0x4000U - iVar5 != (uint)sVar2) {
          *(undefined4 *)((long)file + 0x70) = 0xffffffff;
          return -1;
        }
        *(undefined8 *)((long)file + 0x18) = *(undefined8 *)((long)file + 0x88);
        *(undefined4 *)((long)file + 0x20) = 0x4000;
      }
      if (bVar4) {
        uVar1 = *(uint *)((long)file + 0x70);
        break;
      }
      *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + 0x4000;
      uVar1 = cm_zlib_deflate((z_streamp_conflict)file,flush);
      *(uint *)((long)file + 0x70) = uVar1;
      uVar6 = (ulong)*(uint *)((long)file + 0x20);
      *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) - uVar6;
      if (uVar1 == 0xfffffffb && iVar5 == 0x4000) {
        *(undefined4 *)((long)file + 0x70) = 0;
        uVar1 = 0;
      }
      bVar4 = uVar1 == 1 || *(uint *)((long)file + 0x20) != 0;
    } while (uVar1 < 2);
    uVar3 = 0;
    if (uVar1 != 1) {
      uVar3 = uVar1;
    }
  }
  return uVar3;
}

Assistant:

local int do_flush (file, flush)
    gzFile file;
    int flush;
{
    uInt len;
    int done = 0;
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'w') return Z_STREAM_ERROR;

    s->stream.avail_in = 0; /* should be zero already anyway */

    for (;;) {
        len = Z_BUFSIZE - s->stream.avail_out;

        if (len != 0) {
            if ((uInt)fwrite(s->outbuf, 1, len, s->file) != len) {
                s->z_err = Z_ERRNO;
                return Z_ERRNO;
            }
            s->stream.next_out = s->outbuf;
            s->stream.avail_out = Z_BUFSIZE;
        }
        if (done) break;
        s->out += s->stream.avail_out;
        s->z_err = deflate(&(s->stream), flush);
        s->out -= s->stream.avail_out;

        /* Ignore the second of two consecutive flushes: */
        if (len == 0 && s->z_err == Z_BUF_ERROR) s->z_err = Z_OK;

        /* deflate has finished flushing only when it hasn't used up
         * all the available space in the output buffer:
         */
        done = (s->stream.avail_out != 0 || s->z_err == Z_STREAM_END);

        if (s->z_err != Z_OK && s->z_err != Z_STREAM_END) break;
    }
    return  s->z_err == Z_STREAM_END ? Z_OK : s->z_err;
}